

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

void __thiscall
pbrt::BDPTIntegrator::BDPTIntegrator
          (BDPTIntegrator *this,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int maxDepth,
          bool visualizeStrategies,bool visualizeWeights,string *lightSampleStrategy,bool regularize
          )

{
  pointer pcVar1;
  pointer pLVar2;
  pointer pLVar3;
  PowerLightSampler *this_00;
  Allocator alloc;
  span<const_pbrt::LightHandle> lights_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_48;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  local_38.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_40.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_48.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_60,lights);
  RayIntegrator::RayIntegrator
            (&this->super_RayIntegrator,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,
             (PrimitiveHandle *)&local_48,&local_60);
  if (local_60.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__BDPTIntegrator_031e5c10;
  this->maxDepth = maxDepth;
  this->visualizeStrategies = visualizeStrategies;
  this->visualizeWeights = visualizeWeights;
  (this->lightSampleStrategy)._M_dataplus._M_p = (pointer)&(this->lightSampleStrategy).field_2;
  pcVar1 = (lightSampleStrategy->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lightSampleStrategy,pcVar1,
             pcVar1 + lightSampleStrategy->_M_string_length);
  this->regularize = regularize;
  this_00 = (PowerLightSampler *)operator_new(0x70);
  pLVar2 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = (long)pLVar3 - (long)pLVar2 >> 3;
  lights_00.ptr = pLVar2;
  PowerLightSampler::PowerLightSampler(this_00,lights_00,alloc);
  (this->lightSampler).
  super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  .bits = (ulong)this_00 | 0x2000000000000;
  (this->weightFilms).super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weightFilms).super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weightFilms).super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

BDPTIntegrator(CameraHandle camera, SamplerHandle sampler, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int maxDepth,
                   bool visualizeStrategies, bool visualizeWeights,
                   const std::string &lightSampleStrategy = "power",
                   bool regularize = false)
        : RayIntegrator(camera, sampler, aggregate, lights),
          maxDepth(maxDepth),
          visualizeStrategies(visualizeStrategies),
          visualizeWeights(visualizeWeights),
          lightSampleStrategy(lightSampleStrategy),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          regularize(regularize) {}